

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

char * get_reg_var_name(c2m_ctx_t c2m_ctx,MIR_type_t promoted_type,char *suffix,uint func_scope_num)

{
  char *str;
  str_t sVar1;
  char *local_98;
  char *local_90;
  char *local_88;
  char *local_80;
  char *local_78;
  char *local_68;
  char local_58 [8];
  char prefix [50];
  uint func_scope_num_local;
  char *suffix_local;
  MIR_type_t promoted_type_local;
  c2m_ctx_t c2m_ctx_local;
  
  if (promoted_type == MIR_T_I64) {
    local_78 = "I%u_";
  }
  else {
    if (promoted_type == MIR_T_U64) {
      local_80 = "U%u_";
    }
    else {
      if (promoted_type == MIR_T_I32) {
        local_88 = "i%u_";
      }
      else {
        if (promoted_type == MIR_T_U32) {
          local_90 = "u%u_";
        }
        else {
          if (promoted_type == MIR_T_F) {
            local_98 = "f%u_";
          }
          else {
            local_98 = "D%u_";
            if (promoted_type == MIR_T_D) {
              local_98 = "d%u_";
            }
          }
          local_90 = local_98;
        }
        local_88 = local_90;
      }
      local_80 = local_88;
    }
    local_78 = local_80;
  }
  prefix._44_4_ = func_scope_num;
  unique0x100000bb = suffix;
  sprintf(local_58,local_78,(ulong)func_scope_num);
  VARR_chartrunc(c2m_ctx->temp_string,0);
  add_to_temp_string(c2m_ctx,local_58);
  add_to_temp_string(c2m_ctx,stack0xffffffffffffffe0);
  str = VARR_charaddr(c2m_ctx->temp_string);
  sVar1 = uniq_cstr(c2m_ctx,str);
  local_68 = sVar1.s;
  return local_68;
}

Assistant:

static const char *get_reg_var_name (c2m_ctx_t c2m_ctx, MIR_type_t promoted_type,
                                     const char *suffix, unsigned func_scope_num) {
  char prefix[50];

  sprintf (prefix,
           promoted_type == MIR_T_I64   ? "I%u_"
           : promoted_type == MIR_T_U64 ? "U%u_"
           : promoted_type == MIR_T_I32 ? "i%u_"
           : promoted_type == MIR_T_U32 ? "u%u_"
           : promoted_type == MIR_T_F   ? "f%u_"
           : promoted_type == MIR_T_D   ? "d%u_"
                                        : "D%u_",
           func_scope_num);
  VARR_TRUNC (char, temp_string, 0);
  add_to_temp_string (c2m_ctx, prefix);
  add_to_temp_string (c2m_ctx, suffix);
  return uniq_cstr (c2m_ctx, VARR_ADDR (char, temp_string)).s;
}